

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

void __thiscall
glslang::TDefaultGlslIoResolver::reserverStorageSlot
          (TDefaultGlslIoResolver *this,TVarEntryInfo *ent,TInfoSink *infoSink)

{
  int iVar1;
  EShLanguage EVar2;
  undefined4 extraout_var;
  key_type *__k;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
  *this_00;
  iterator iVar3;
  uint *puVar4;
  uint uVar5;
  int storageKey;
  uint local_5c;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  TType *type;
  undefined4 extraout_var_00;
  
  iVar1 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  type = (TType *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  __k = (key_type *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*type->_vptr_TType[0xb])(type);
  uVar5 = *(uint *)(CONCAT44(extraout_var_01,iVar1) + 8) & 0x7f;
  if (uVar5 - 3 < 2) {
    iVar1 = (*type->_vptr_TType[0xb])(type);
    if ((~*(uint *)(CONCAT44(extraout_var_02,iVar1) + 0x1c) & 0xfff) == 0) {
      return;
    }
    EVar2 = EShLangCount;
    if (uVar5 == 3) {
      EVar2 = this->preStage;
    }
    if (uVar5 == 4) {
      EVar2 = this->currentStage;
    }
    if (0xffff < EVar2) {
      __assert_fail("static_cast<uint32_t>(stage) <= 0x0000ffff && static_cast<uint32_t>(type) <= 0x0000ffff"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/iomapper.h"
                    ,0xaf,
                    "int glslang::TDefaultGlslIoResolver::buildStorageKey(EShLanguage, TStorageQualifier)"
                   );
    }
    local_5c = EVar2 << 0x10 | 0x12;
  }
  else {
    if (uVar5 != 5) {
      return;
    }
    iVar1 = (*type->_vptr_TType[7])(type);
    if (iVar1 == 0x10) {
      return;
    }
    iVar1 = (*type->_vptr_TType[0xb])(type);
    if ((~*(uint *)(CONCAT44(extraout_var_03,iVar1) + 0x1c) & 0xfff) == 0) {
      return;
    }
    local_5c = 0xe0005;
  }
  iVar1 = (*type->_vptr_TType[0xb])(type);
  uVar5 = *(uint *)(CONCAT44(extraout_var_04,iVar1) + 0x1c) & 0xfff;
  this_00 = &std::
             map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
             ::operator[](&this->storageSlotMap,(key_type_conflict1 *)&local_5c)->_M_t;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
          ::find(this_00,__k);
  if ((_Rb_tree_header *)iVar3._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
    iVar1 = TIntermediate::computeTypeUniformLocationSize(type);
    TDefaultIoResolverBase::reserveSlot(&this->super_TDefaultIoResolverBase,local_5c,uVar5,iVar1);
    puVar4 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                                   *)this_00,__k);
    *puVar4 = uVar5;
  }
  else if (*(uint *)&iVar3._M_node[2]._M_parent != uVar5) {
    std::operator+(&local_58,"Invalid location: ",__k);
    TInfoSinkBase::message(&infoSink->info,EPrefixInternalError,local_58._M_dataplus._M_p);
    (this->super_TDefaultIoResolverBase).hasError = true;
  }
  return;
}

Assistant:

void TDefaultGlslIoResolver::reserverStorageSlot(TVarEntryInfo& ent, TInfoSink& infoSink) {
    const TType& type = ent.symbol->getType();
    const TString& name = ent.symbol->getAccessName();
    TStorageQualifier storage = type.getQualifier().storage;
    EShLanguage stage(EShLangCount);
    switch (storage) {
    case EvqUniform:
        if (type.getBasicType() != EbtBlock && type.getQualifier().hasLocation()) {
            //
            // Reserve the slots for the uniforms who has explicit location
            int storageKey = buildStorageKey(EShLangCount, EvqUniform);
            int location = type.getQualifier().layoutLocation;
            TVarSlotMap& varSlotMap = storageSlotMap[storageKey];
            TVarSlotMap::iterator iter = varSlotMap.find(name);
            if (iter == varSlotMap.end()) {
                int numLocations = TIntermediate::computeTypeUniformLocationSize(type);
                reserveSlot(storageKey, location, numLocations);
                varSlotMap[name] = location;
            } else {
                // Allocate location by name for OpenGL driver, so the uniform in different
                // stages should be declared with the same location
                if (iter->second != location) {
                    TString errorMsg = "Invalid location: " + name;
                    infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
                    hasError = true;
                }
            }
        }
        break;
    case EvqVaryingIn:
    case EvqVaryingOut:
        //
        // Reserve the slots for the inout who has explicit location
        if (type.getQualifier().hasLocation()) {
            stage = storage == EvqVaryingIn ? preStage : stage;
            stage = storage == EvqVaryingOut ? currentStage : stage;
            int storageKey = buildStorageKey(stage, EvqInOut);
            int location = type.getQualifier().layoutLocation;
            TVarSlotMap& varSlotMap = storageSlotMap[storageKey];
            TVarSlotMap::iterator iter = varSlotMap.find(name);
            if (iter == varSlotMap.end()) {
                int numLocations = TIntermediate::computeTypeUniformLocationSize(type);
                reserveSlot(storageKey, location, numLocations);
                varSlotMap[name] = location;
            } else {
                // Allocate location by name for OpenGL driver, so the uniform in different
                // stages should be declared with the same location
                if (iter->second != location) {
                    TString errorMsg = "Invalid location: " + name;
                    infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
                    hasError = true;
                }
            }
        }
        break;
    default:
        break;
    }
}